

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RowSetEntry * rowSetListToTree(RowSetEntry *pList)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  RowSetEntry *in_RDI;
  RowSetEntry *pLeft;
  RowSetEntry *p;
  int iDepth;
  RowSetEntry *local_8;
  
  local_8 = in_RDI->pRight;
  in_RDI->pRight = (RowSetEntry *)0x0;
  in_RDI->pLeft = (RowSetEntry *)0x0;
  while (local_8 != (RowSetEntry *)0x0) {
    pRVar1 = local_8->pRight;
    local_8->pLeft = in_RDI;
    pRVar2 = rowSetNDeepTree((RowSetEntry **)local_8,(int)((ulong)in_RDI >> 0x20));
    local_8->pRight = pRVar2;
    in_RDI = local_8;
    local_8 = pRVar1;
  }
  return in_RDI;
}

Assistant:

static struct RowSetEntry *rowSetListToTree(struct RowSetEntry *pList){
  int iDepth;           /* Depth of the tree so far */
  struct RowSetEntry *p;       /* Current tree root */
  struct RowSetEntry *pLeft;   /* Left subtree */

  assert( pList!=0 );
  p = pList;
  pList = p->pRight;
  p->pLeft = p->pRight = 0;
  for(iDepth=1; pList; iDepth++){
    pLeft = p;
    p = pList;
    pList = p->pRight;
    p->pLeft = pLeft;
    p->pRight = rowSetNDeepTree(&pList, iDepth);
  }
  return p;
}